

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

Arena * tcmalloc::LowLevelAlloc::NewArenaWithCustomAlloc(PagesAllocator *allocator)

{
  int iVar1;
  undefined4 extraout_var;
  Arena *this;
  Arena *result;
  pair<void_*,_unsigned_long> local_38;
  long local_28;
  size_t got_amount;
  void *memory;
  PagesAllocator *allocator_local;
  
  memory = allocator;
  if (allocator == (PagesAllocator *)0x0) {
    this = (Arena *)AllocWithArena(0x140,(Arena *)0x0);
    Arena::Arena(this);
    allocator_local = (PagesAllocator *)this;
  }
  else {
    iVar1 = (*allocator->_vptr_PagesAllocator[2])(allocator,0x100000);
    local_38.first = (void *)CONCAT44(extraout_var,iVar1);
    std::tie<void*,unsigned_long>(&result,&got_amount);
    std::tuple<void*&,unsigned_long&>::operator=((tuple<void*&,unsigned_long&> *)&result,&local_38);
    Arena::Arena((Arena *)got_amount);
    *(void **)(got_amount + 0x138) = memory;
    SpinLock::Lock((SpinLock *)got_amount);
    Arena::InsertAllocatedMemoryLocked
              ((Arena *)got_amount,(void *)(got_amount + 0x140),local_28 - 0x140);
    SpinLock::Unlock((SpinLock *)got_amount);
    allocator_local = (PagesAllocator *)got_amount;
  }
  return (Arena *)allocator_local;
}

Assistant:

LowLevelAlloc::Arena *LowLevelAlloc::NewArenaWithCustomAlloc(PagesAllocator *allocator) {
  if (allocator) {
    void* memory;
    size_t got_amount;
    std::tie(memory, got_amount) = allocator->MapPages(kMinimalRegion);

    Arena *result = new (memory) Arena();
    result->allocator = allocator;
    result->mu.Lock();
    result->InsertAllocatedMemoryLocked(result + 1, got_amount - sizeof(Arena));
    result->mu.Unlock();
    return result;
  }

  return new (AllocWithArena(sizeof(Arena), nullptr)) Arena();
}